

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdebug.cpp
# Opt level: O2

void __thiscall QDebug::~QDebug(QDebug *this)

{
  int *piVar1;
  bool bVar2;
  int frameCount;
  Stream *this_00;
  long in_FS_OFFSET;
  QInternalMessageLogContext local_160;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = this->stream;
  if (this_00 == (Stream *)0x0) goto LAB_0020f7b5;
  piVar1 = &this_00->ref;
  *piVar1 = *piVar1 + -1;
  if (*piVar1 != 0) goto LAB_0020f7b5;
  if (this_00->space == true) {
    bVar2 = QString::endsWith(&this_00->buffer,(QChar)0x20,CaseSensitive);
    this_00 = this->stream;
    if (bVar2) {
      QString::chop(&this_00->buffer,1);
      this_00 = this->stream;
    }
  }
  if (this_00->message_output == true) {
    memset(&local_160.backtrace,0xaa,0x120);
    local_160.super_QMessageLogContext.version = 2;
    local_160.super_QMessageLogContext._4_8_ = 0;
    local_160.super_QMessageLogContext.file._4_4_ = 0;
    local_160.super_QMessageLogContext.function._0_4_ = 0;
    local_160.super_QMessageLogContext.function._4_4_ = 0;
    local_160.super_QMessageLogContext.category = (char *)0x0;
    local_160.backtrace.super__Optional_base<QVarLengthArray<void_*,_32LL>,_false,_false>._M_payload
    .super__Optional_payload<QVarLengthArray<void_*,_32LL>,_true,_false,_false>.
    super__Optional_payload_base<QVarLengthArray<void_*,_32LL>_>._M_engaged = false;
    frameCount = QInternalMessageLogContext::initFrom(&local_160,&this_00->context);
    if (frameCount != 0) {
      QInternalMessageLogContext::populateBacktrace(&local_160,frameCount);
    }
    qt_message_output(this->stream->type,&local_160.super_QMessageLogContext,&this->stream->buffer);
    std::_Optional_payload_base<QVarLengthArray<void_*,_32LL>_>::_M_reset
              ((_Optional_payload_base<QVarLengthArray<void_*,_32LL>_> *)&local_160.backtrace);
    this_00 = this->stream;
    if (this_00 != (Stream *)0x0) goto LAB_0020f7a2;
    this_00 = (Stream *)0x0;
  }
  else {
LAB_0020f7a2:
    Stream::~Stream(this_00);
  }
  operator_delete(this_00,0x58);
LAB_0020f7b5:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QDebug::~QDebug()
{
    if (stream && !--stream->ref) {
        if (stream->space && stream->buffer.endsWith(u' '))
            stream->buffer.chop(1);
        if (stream->message_output) {
            QInternalMessageLogContext ctxt(stream->context);
            qt_message_output(stream->type,
                              ctxt,
                              stream->buffer);
        }
        delete stream;
    }
}